

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffghof(fitsfile *fptr,off_t *headstart,off_t *datastart,off_t *dataend,int *status)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  int local_4;
  
  if (*in_R8 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000d8,in_stack_000000d0), 0 < iVar1)) {
        return *in_R8;
      }
    }
    else {
      iVar1 = ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
      if (0 < iVar1) {
        return *in_R8;
      }
    }
    if (in_RSI != (undefined8 *)0x0) {
      *in_RSI = *(undefined8 *)
                 (*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8);
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = *(undefined8 *)(*(long *)(in_RDI + 2) + 0x88);
    }
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = *(undefined8 *)
                 (*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1) * 8);
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffghof(fitsfile *fptr,     /* I - FITS file pointer                     */
            OFF_T *headstart,  /* O - byte offset to beginning of CHDU      */
            OFF_T *datastart,  /* O - byte offset to beginning of next HDU  */
            OFF_T *dataend,    /* O - byte offset to beginning of next HDU  */
            int *status)       /* IO - error status     */
/*
  Return the address (= byte offset) in the FITS file to the beginning of
  the current HDU, the beginning of the data unit, and the end of the data unit.
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        if (ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status) > 0)
            return(*status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if (ffrdef(fptr, status) > 0)           /* rescan header */
            return(*status);
    }

    if (headstart)
        *headstart = (OFF_T) (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu];       

    if (datastart)
        *datastart = (OFF_T) (fptr->Fptr)->datastart;

    if (dataend)
        *dataend   = (OFF_T) (fptr->Fptr)->headstart[((fptr->Fptr)->curhdu) + 1];       

    return(*status);
}